

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.h
# Opt level: O0

void __thiscall
cnn::LookupNode::LookupNode
          (LookupNode *this,LookupParameters *p,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  size_type sVar4;
  _func_int **in_RSI;
  ParameterNodeBase *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000018;
  
  ParameterNodeBase::ParameterNodeBase(in_RDI);
  (in_RDI->super_Node)._vptr_Node = (_func_int **)&PTR__LookupNode_00565940;
  in_RDI[1].super_Node.dim.d[0] = *(uint *)(in_RSI + 5);
  pVVar1 = (pointer)in_RSI[2];
  pVVar2 = (pointer)in_RSI[3];
  pVVar3 = (pointer)in_RSI[4];
  in_RDI[1].super_Node._vptr_Node = (_func_int **)in_RSI[1];
  in_RDI[1].super_Node.args.
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_start = pVVar1;
  in_RDI[1].super_Node.args.
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar2;
  in_RDI[1].super_Node.args.
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pVVar3;
  in_RDI[1].super_Node.dim.d[1] = 0;
  in_RDI[1].super_Node.dim.d[2] = 0;
  in_RDI[1].super_Node.dim.d[3] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(indices,in_stack_00000018);
  in_RDI[1].super_Node.aux_mem = in_RDI[1].super_Node.dim.d + 4;
  in_RDI[2].super_Node._vptr_Node = in_RSI;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_RDI[1].super_Node.aux_mem);
  in_RDI[1].super_Node.dim.d[0] = (uint)sVar4;
  return;
}

Assistant:

LookupNode(LookupParameters* p, const std::vector<unsigned>& indices) : dim(p->dim), index(), pindex(), indices(indices), pindices(&this->indices), params(p) {
    dim.bd = pindices->size();
  }